

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::ComputeDefines
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *headTarget;
  cmNinjaTargetGenerator *this_00;
  string *s;
  int iVar3;
  cmGlobalNinjaGenerator *pcVar4;
  cmValue cVar5;
  string *psVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string defPropName;
  string *definesString;
  string COMPILE_DEFINITIONS;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_228;
  string local_208;
  string *local_1e8;
  cmNinjaTargetGenerator *local_1e0;
  string *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  cmGeneratorExpressionInterpreter local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  size_type local_60;
  pointer local_58;
  string *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = this->LocalGenerator;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  local_1e8 = __return_storage_ptr__;
  local_1d8 = config;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar2,pcVar2 + config->_M_string_length);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = (language->_M_dataplus)._M_p;
  local_1e0 = this;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar2,pcVar2 + language->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_e8,(cmLocalGenerator *)pcVar1,&local_208,headTarget,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  s = local_1d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  this_00 = local_1e0;
  pcVar4 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(local_1e0->LocalGenerator);
  iVar3 = (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])(pcVar4);
  if ((char)iVar3 != '\0') {
    local_78.first._M_len = 0xe;
    local_78.first._M_str = "CMAKE_INTDIR=\"";
    local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58 = (s->_M_dataplus)._M_p;
    local_60 = s->_M_string_length;
    local_50 = (string *)0x0;
    local_150.field_2._M_allocated_capacity = (long)&local_150.field_2 + 8;
    local_150._M_dataplus._M_p = (pointer)0x0;
    local_150._M_string_length = 1;
    local_150.field_2._M_local_buf[8] = '\"';
    local_48 = 1;
    local_38 = 0;
    views._M_len = 3;
    views._M_array = &local_78;
    local_40 = (undefined1 *)local_150.field_2._M_allocated_capacity;
    cmCatViews(&local_228,views);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_118,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"COMPILE_DEFINITIONS","");
  cVar5 = cmSourceFile::GetProperty(source,&local_150);
  if (cVar5.Value != (string *)0x0) {
    pcVar1 = this_00->LocalGenerator;
    pcVar2 = ((cVar5.Value)->_M_dataplus)._M_p;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar2,pcVar2 + (cVar5.Value)->_M_string_length);
    psVar6 = cmGeneratorExpressionInterpreter::Evaluate(&local_e8,&local_190,&local_150);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_118,psVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::UpperCase(&local_1b0,s);
  local_78.first._M_len = 0x14;
  local_78.first._M_str = "COMPILE_DEFINITIONS_";
  local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60 = local_1b0._M_string_length;
  local_58 = local_1b0._M_dataplus._M_p;
  views_00._M_len = 2;
  views_00._M_array = &local_78;
  local_50 = &local_1b0;
  cmCatViews(&local_228,views_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  cVar5 = cmSourceFile::GetProperty(source,&local_228);
  if (cVar5.Value != (string *)0x0) {
    pcVar1 = this_00->LocalGenerator;
    pcVar2 = ((cVar5.Value)->_M_dataplus)._M_p;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar2,pcVar2 + (cVar5.Value)->_M_string_length);
    psVar6 = cmGeneratorExpressionInterpreter::Evaluate(&local_e8,&local_1d0,&local_150);
    cmLocalGenerator::AppendDefines
              ((cmLocalGenerator *)pcVar1,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_118,psVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar6 = local_1e8;
  cmCommonTargetGenerator::GetDefines(local_1e8,&this_00->super_cmCommonTargetGenerator,language,s);
  cmLocalGenerator::JoinDefines
            ((cmLocalGenerator *)this_00->LocalGenerator,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118,psVar6,language);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,(ulong)(local_150.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.Language._M_dataplus._M_p != &local_e8.Language.field_2) {
    operator_delete(local_e8.Language._M_dataplus._M_p,
                    local_e8.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.Config._M_dataplus._M_p != &local_e8.Config.field_2) {
    operator_delete(local_e8.Config._M_dataplus._M_p,
                    local_e8.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_e8.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&local_e8.GeneratorExpression);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_118);
  return psVar6;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeDefines(cmSourceFile const* source,
                                                   const std::string& language,
                                                   const std::string& config)
{
  std::set<std::string> defines;
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  // Seriously??
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    defines.insert(cmStrCat("CMAKE_INTDIR=\"", config, '"'));
  }

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (cmValue compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    this->LocalGenerator->AppendDefines(
      defines, genexInterpreter.Evaluate(*compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName =
    cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(config));
  if (cmValue config_compile_defs = source->GetProperty(defPropName)) {
    this->LocalGenerator->AppendDefines(
      defines,
      genexInterpreter.Evaluate(*config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString = this->GetDefines(language, config);
  this->LocalGenerator->JoinDefines(defines, definesString, language);

  return definesString;
}